

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjSaveImage(char *filename,uchar *buffer,int width,int pitch,int height,int pixelFormat,
               int flags)

{
  int iVar1;
  char *pcVar2;
  j_decompress_ptr pjVar3;
  int *piVar4;
  char *pcVar5;
  j_decompress_ptr cinfo;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar6;
  uchar *rowptr;
  boolean invert;
  char *ptr;
  FILE *file;
  djpeg_dest_ptr dst;
  j_decompress_ptr dinfo;
  tjinstance *this;
  tjhandle handle;
  int retval;
  j_decompress_ptr in_stack_ffffffffffffff90;
  boolean in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  FILE *local_58;
  djpeg_dest_ptr local_50;
  tjhandle local_38;
  int local_2c;
  int local_20;
  
  local_2c = 0;
  local_38 = (tjhandle)0x0;
  local_58 = (FILE *)0x0;
  if (((((in_RDI == (char *)0x0) || (in_RSI == 0)) || (in_EDX < 1)) ||
      ((in_ECX < 0 || (in_R8D < 1)))) || ((in_R9D < 0 || (0xb < in_R9D)))) {
    pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar2,200,"%s","tjSaveImage(): Invalid argument");
    local_2c = -1;
  }
  else {
    local_38 = tjInitDecompress();
    if (local_38 == (tjhandle)0x0) {
      return -1;
    }
    pjVar3 = (j_decompress_ptr)((long)local_38 + 0x208);
    local_58 = fopen(in_RDI,"wb");
    if (local_58 == (FILE *)0x0) {
      pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      snprintf(pcVar2,200,"%s\n%s","tjSaveImage(): Cannot open output file",pcVar5);
      local_2c = -1;
    }
    else {
      iVar1 = _setjmp((__jmp_buf_tag *)((long)local_38 + 0x528));
      if (iVar1 == 0) {
        *(J_COLOR_SPACE *)((long)local_38 + 0x248) = pf2cs[in_R9D];
        *(int *)((long)local_38 + 0x238) = in_EDX;
        *(int *)((long)local_38 + 0x23c) = in_R8D;
        *(undefined4 *)((long)local_38 + 0x22c) = 0xca;
        *(undefined4 *)((long)local_38 + 0x250) = 1;
        *(undefined4 *)((long)local_38 + 0x24c) = 1;
        cinfo = (j_decompress_ptr)strrchr(in_RDI,0x2e);
        if ((cinfo == (j_decompress_ptr)0x0) ||
           (iVar1 = strcasecmp((char *)cinfo,".bmp"), iVar1 != 0)) {
          local_50 = jinit_write_ppm(in_stack_ffffffffffffff90);
          if (local_50 == (djpeg_dest_ptr)0x0) {
            pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
            snprintf(pcVar2,200,"%s","tjSaveImage(): Could not initialize PPM writer");
            local_2c = -1;
            goto LAB_00181316;
          }
          bVar6 = ((uint)rowptr & 2) != 0;
        }
        else {
          local_50 = jinit_write_bmp(cinfo,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
          if (local_50 == (djpeg_dest_ptr)0x0) {
            pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
            snprintf(pcVar2,200,"%s","tjSaveImage(): Could not initialize bitmap writer");
            local_2c = -1;
            goto LAB_00181316;
          }
          bVar6 = ((uint)rowptr & 2) == 0;
        }
        in_stack_ffffffffffffff9c = (uint)bVar6;
        local_50->output_file = (FILE *)local_58;
        (*local_50->start_output)(pjVar3,local_50);
        (**(code **)(*(long *)((long)local_38 + 0x210) + 0x30))(pjVar3);
        local_20 = in_ECX;
        if (in_ECX == 0) {
          local_20 = in_EDX * tjPixelSize[in_R9D];
        }
        while (*(uint *)((long)local_38 + 0x2b0) < *(uint *)((long)local_38 + 0x294)) {
          if (in_stack_ffffffffffffff9c == 0) {
            iVar1 = *(int *)((long)local_38 + 0x2b0);
          }
          else {
            iVar1 = (in_R8D - *(int *)((long)local_38 + 0x2b0)) + -1;
          }
          memcpy(*local_50->buffer,(void *)(in_RSI + (ulong)(uint)(iVar1 * local_20)),
                 (long)(in_EDX * tjPixelSize[in_R9D]));
          (*local_50->put_pixel_rows)(pjVar3,local_50,1);
          *(int *)((long)local_38 + 0x2b0) = *(int *)((long)local_38 + 0x2b0) + 1;
        }
        (*local_50->finish_output)(pjVar3,local_50);
      }
      else {
        local_2c = -1;
      }
    }
  }
LAB_00181316:
  if (local_38 != (tjhandle)0x0) {
    tjDestroy((tjhandle)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  if (local_58 != (FILE *)0x0) {
    fclose(local_58);
  }
  return local_2c;
}

Assistant:

DLLEXPORT int tjSaveImage(const char *filename, unsigned char *buffer,
                          int width, int pitch, int height, int pixelFormat,
                          int flags)
{
  int retval = 0;
  tjhandle handle = NULL;
  tjinstance *this;
  j_decompress_ptr dinfo = NULL;
  djpeg_dest_ptr dst;
  FILE *file = NULL;
  char *ptr = NULL;
  boolean invert;

  if (!filename || !buffer || width < 1 || pitch < 0 || height < 1 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROWG("tjSaveImage(): Invalid argument");

  if ((handle = tjInitDecompress()) == NULL)
    return -1;
  this = (tjinstance *)handle;
  dinfo = &this->dinfo;

  if ((file = fopen(filename, "wb")) == NULL)
    THROW_UNIX("tjSaveImage(): Cannot open output file");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  this->dinfo.out_color_space = pf2cs[pixelFormat];
  dinfo->image_width = width;  dinfo->image_height = height;
  dinfo->global_state = DSTATE_READY;
  dinfo->scale_num = dinfo->scale_denom = 1;

  ptr = strrchr(filename, '.');
  if (ptr && !strcasecmp(ptr, ".bmp")) {
    if ((dst = jinit_write_bmp(dinfo, FALSE, FALSE)) == NULL)
      THROWG("tjSaveImage(): Could not initialize bitmap writer");
    invert = (flags & TJFLAG_BOTTOMUP) == 0;
  } else {
    if ((dst = jinit_write_ppm(dinfo)) == NULL)
      THROWG("tjSaveImage(): Could not initialize PPM writer");
    invert = (flags & TJFLAG_BOTTOMUP) != 0;
  }

  dst->output_file = file;
  (*dst->start_output) (dinfo, dst);
  (*dinfo->mem->realize_virt_arrays) ((j_common_ptr)dinfo);

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  while (dinfo->output_scanline < dinfo->output_height) {
    unsigned char *rowptr;

    if (invert)
      rowptr = &buffer[(height - dinfo->output_scanline - 1) * pitch];
    else
      rowptr = &buffer[dinfo->output_scanline * pitch];
    memcpy(dst->buffer[0], rowptr, width * tjPixelSize[pixelFormat]);
    (*dst->put_pixel_rows) (dinfo, dst, 1);
    dinfo->output_scanline++;
  }

  (*dst->finish_output) (dinfo, dst);

bailout:
  if (handle) tjDestroy(handle);
  if (file) fclose(file);
  return retval;
}